

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-title-threadsafe.c
# Opt level: O0

int run_test_process_title_threadsafe(void)

{
  int iVar1;
  int local_34;
  undefined1 local_30 [4];
  int i;
  uv_thread_t getter_thread;
  uv_thread_t setter_threads [4];
  
  iVar1 = uv_set_process_title(titles[0]);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
            ,0x4f,"0 == uv_set_process_title(titles[0])");
    abort();
  }
  iVar1 = uv_thread_create(local_30,getter_thread_body,0);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
            ,0x50,"0 == uv_thread_create(&getter_thread, getter_thread_body, NULL)");
    abort();
  }
  local_34 = 0;
  while( true ) {
    if (3 < local_34) {
      local_34 = 0;
      while( true ) {
        if (3 < local_34) {
          return 0;
        }
        iVar1 = uv_thread_join(setter_threads + (long)local_34 + -1);
        if (iVar1 != 0) break;
        local_34 = local_34 + 1;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
              ,0x56,"0 == uv_thread_join(&setter_threads[i])");
      abort();
    }
    iVar1 = uv_thread_create(setter_threads + (long)local_34 + -1,setter_thread_body,0);
    if (iVar1 != 0) break;
    local_34 = local_34 + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-process-title-threadsafe.c"
          ,0x53,"0 == uv_thread_create(&setter_threads[i], setter_thread_body, NULL)");
  abort();
}

Assistant:

TEST_IMPL(process_title_threadsafe) {
  uv_thread_t setter_threads[4];
  uv_thread_t getter_thread;
  int i;

#if defined(__sun) || defined(__CYGWIN__) || defined(__MSYS__) || \
    defined(__MVS__) || defined(__PASE__)
  RETURN_SKIP("uv_(get|set)_process_title is not implemented.");
#endif

  ASSERT(0 == uv_set_process_title(titles[0]));
  ASSERT(0 == uv_thread_create(&getter_thread, getter_thread_body, NULL));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT(0 == uv_thread_create(&setter_threads[i], setter_thread_body, NULL));

  for (i = 0; i < (int) ARRAY_SIZE(setter_threads); i++)
    ASSERT(0 == uv_thread_join(&setter_threads[i]));

  return 0;
}